

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_EmplaceHint_Test::TestBody(DenseHashMapMoveTest_EmplaceHint_Test *this)

{
  const_iterator hint;
  const_iterator hint_00;
  const_iterator hint_01;
  const_iterator hint_02;
  const_iterator hint_03;
  const_iterator hint_04;
  bool bVar1;
  undefined4 uVar2;
  pointer expected_predicate_value;
  data_type *pdVar3;
  data_type *pdVar4;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *this_00;
  char *file;
  char *message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  h;
  key_type *in_stack_fffffffffffffae8;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *pdVar5;
  allocator_type *in_stack_fffffffffffffaf0;
  AssertionResult *pAVar6;
  key_equal *in_stack_fffffffffffffaf8;
  pointer ppVar7;
  hasher *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  int line;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffb10;
  Type in_stack_fffffffffffffb1c;
  Type TVar8;
  AssertHelper *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  undefined1 uVar9;
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffb30;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> *this_01;
  char *in_stack_fffffffffffffb60;
  AssertionResult *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  undefined4 uVar10;
  AssertionResult local_488;
  string local_478 [48];
  undefined4 local_448;
  undefined4 local_444;
  iterator local_440;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_428 [2];
  AssertionResult local_3f0;
  string local_3e0 [52];
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  iterator local_3a0;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_388 [2];
  AssertionResult local_350;
  string local_340 [52];
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  iterator local_300;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_2e8 [2];
  AssertionResult local_2b0 [2];
  undefined4 local_290;
  undefined4 local_28c;
  AssertionResult local_288;
  string local_278 [48];
  undefined4 local_248;
  undefined4 local_244;
  iterator local_240;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_228 [2];
  byte local_1f8;
  byte local_1e9;
  AssertionResult local_1e8;
  string local_1d8 [52];
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  iterator local_198;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_180 [2];
  byte local_150;
  byte local_141;
  AssertionResult local_140;
  uint local_12c;
  string local_128 [52];
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  iterator local_e8;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_d0 [2];
  byte local_a0;
  byte local_91;
  AssertionResult local_90;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  libc_allocator_with_realloc<std::pair<const_int,_int>_> local_5b [91];
  
  this_01 = local_5b;
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::libc_allocator_with_realloc
            (this_01);
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffb10,
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                   in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
  google::libc_allocator_with_realloc<std::pair<const_int,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  local_70 = 0;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::set_empty_key((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  local_74 = 1;
  expected_predicate_value =
       (pointer)google::
                dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                              *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  expected_predicate_value->first = 1;
  local_78 = 3;
  pdVar3 = google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  *pdVar3 = 3;
  local_7c = 5;
  pdVar4 = google::
           dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           ::operator[]((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  *pdVar4 = 5;
  local_ec = 1;
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::dense_hashtable_const_iterator(local_d0,&local_e8);
  local_f0 = 1;
  local_f4 = 0;
  hint.pos = (pointer)pdVar3;
  hint.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)pdVar4;
  hint.end = expected_predicate_value;
  google::
  dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
  ::emplace_hint<int,int>
            (in_stack_fffffffffffffb30,hint,
             (int *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
             (int *)in_stack_fffffffffffffb20);
  local_91 = ~local_a0 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d0[0].pos,(bool *)local_d0[0].ht,(type *)0x1077051);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  pdVar5 = local_d0[0].ht;
  pAVar6 = (AssertionResult *)local_d0[0].pos;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,(char *)in_stack_fffffffffffffb10
               ,in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               (Message *)in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0[0].pos);
    std::__cxx11::string::~string(local_128);
    testing::Message::~Message((Message *)0x1077176);
    pdVar5 = local_d0[0].ht;
    pAVar6 = (AssertionResult *)local_d0[0].pos;
  }
  local_12c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1077207);
  if (local_12c == 0) {
    local_19c = 3;
    google::
    dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            *)pAVar6,(key_type *)pdVar5);
    google::
    dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
    ::dense_hashtable_const_iterator(local_180,&local_198);
    local_1a0 = 1;
    local_1a4 = 0;
    hint_00.pos = (pointer)pdVar3;
    hint_00.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)pdVar4;
    hint_00.end = expected_predicate_value;
    google::
    dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
    ::emplace_hint<int,int>
              (in_stack_fffffffffffffb30,hint_00,
               (int *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
               (int *)in_stack_fffffffffffffb20);
    local_141 = ~local_150 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180[0].pos,(bool *)local_180[0].ht,(type *)0x10772db);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    pAVar6 = (AssertionResult *)local_180[0].pos;
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
                 (char *)expected_predicate_value);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                 (char *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                 (char *)in_stack_fffffffffffffb00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 (Message *)in_stack_fffffffffffffb68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_180[0].pos);
      std::__cxx11::string::~string(local_1d8);
      testing::Message::~Message((Message *)0x10773d3);
      pAVar6 = (AssertionResult *)local_180[0].pos;
    }
    local_12c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1077464);
    if (local_12c == 0) {
      google::
      dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)pAVar6);
      google::
      dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
      ::dense_hashtable_const_iterator(local_228,&local_240);
      local_244 = 1;
      local_248 = 0;
      hint_01.pos = (pointer)pdVar3;
      hint_01.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)pdVar4;
      hint_01.end = expected_predicate_value;
      google::
      dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
      ::emplace_hint<int,int>
                (in_stack_fffffffffffffb30,hint_01,
                 (int *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                 (int *)in_stack_fffffffffffffb20);
      local_1e9 = ~local_1f8 & 1;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_228[0].pos,(bool *)local_228[0].ht,(type *)0x1077525);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
      pdVar5 = local_228[0].ht;
      pAVar6 = (AssertionResult *)local_228[0].pos;
      ppVar7 = local_228[0].end;
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
                   (char *)expected_predicate_value);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                   (char *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                   (char *)in_stack_fffffffffffffb00);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                   (Message *)in_stack_fffffffffffffb68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_228[0].pos);
        std::__cxx11::string::~string(local_278);
        testing::Message::~Message((Message *)0x107761d);
        pdVar5 = local_228[0].ht;
        pAVar6 = (AssertionResult *)local_228[0].pos;
        ppVar7 = local_228[0].end;
      }
      local_12c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10776ae);
      if (local_12c == 0) {
        local_28c = 3;
        this_00 = (dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                   *)google::
                     dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     ::size((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                             *)0x10776d7);
        local_290 = SUB84(this_00,0);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                   (char *)in_stack_fffffffffffffb00,&ppVar7->first,(int *)pAVar6);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
        uVar9 = bVar1;
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffb20);
          in_stack_fffffffffffffb20 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x1077780);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
                     (char *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,
                     (char *)in_stack_fffffffffffffb00);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                     (Message *)in_stack_fffffffffffffb68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar6);
          testing::Message::~Message((Message *)0x10777dd);
        }
        local_12c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107784b);
        if (local_12c == 0) {
          local_304 = 1;
          google::
          dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                  *)pAVar6,(key_type *)pdVar5);
          google::
          dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
          ::dense_hashtable_const_iterator(local_2e8,&local_300);
          local_308 = 2;
          local_30c = 0;
          hint_02.pos = (pointer)pdVar3;
          hint_02.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                        *)pdVar4;
          hint_02.end = expected_predicate_value;
          google::
          dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
          ::emplace_hint<int,int>
                    (this_00,hint_02,(int *)CONCAT17(uVar9,in_stack_fffffffffffffb28),
                     (int *)in_stack_fffffffffffffb20);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2e8[0].pos,(bool *)local_2e8[0].ht,(type *)0x107790d);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
          TVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb1c);
          pdVar5 = local_2e8[0].ht;
          pAVar6 = (AssertionResult *)local_2e8[0].pos;
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffb20);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
                       (char *)expected_predicate_value);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffb20,TVar8,(char *)in_stack_fffffffffffffb10,
                       in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70)
                       ,(Message *)in_stack_fffffffffffffb68);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2e8[0].pos);
            std::__cxx11::string::~string(local_340);
            testing::Message::~Message((Message *)0x1077a05);
            pdVar5 = local_2e8[0].ht;
            pAVar6 = (AssertionResult *)local_2e8[0].pos;
          }
          local_12c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1077a96);
          if (local_12c == 0) {
            local_3a4 = 3;
            google::
            dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::find((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                    *)pAVar6,(key_type *)pdVar5);
            google::
            dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
            ::dense_hashtable_const_iterator(local_388,&local_3a0);
            local_3a8 = 4;
            local_3ac = 0;
            hint_03.pos = (pointer)pdVar3;
            hint_03.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                          *)pdVar4;
            hint_03.end = expected_predicate_value;
            google::
            dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
            ::emplace_hint<int,int>
                      (this_00,hint_03,(int *)CONCAT17(uVar9,in_stack_fffffffffffffb28),
                       (int *)in_stack_fffffffffffffb20);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_388[0].pos,(bool *)local_388[0].ht,(type *)0x1077b58
                      );
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_350);
            TVar8 = CONCAT13((char)(TVar8 >> 0x18),CONCAT12(bVar1,(short)TVar8));
            pAVar6 = (AssertionResult *)local_388[0].pos;
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffb20);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
                         (char *)expected_predicate_value);
              std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffb20,TVar8,(char *)in_stack_fffffffffffffb10,
                         in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                         (Message *)in_stack_fffffffffffffb68);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_388[0].pos);
              std::__cxx11::string::~string(local_3e0);
              testing::Message::~Message((Message *)0x1077c50);
              pAVar6 = (AssertionResult *)local_388[0].pos;
            }
            local_12c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1077ce1);
            if (local_12c == 0) {
              google::
              dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              ::end((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)pAVar6);
              google::
              dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              ::dense_hashtable_const_iterator(local_428,&local_440);
              local_444 = 6;
              local_448 = 0;
              hint_04.pos = (pointer)pdVar3;
              hint_04.ht = (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                            *)pdVar4;
              hint_04.end = expected_predicate_value;
              google::
              dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
              ::emplace_hint<int,int>
                        (this_00,hint_04,(int *)CONCAT17(uVar9,in_stack_fffffffffffffb28),
                         (int *)in_stack_fffffffffffffb20);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_428[0].pos,(bool *)local_428[0].ht,
                         (type *)0x1077d90);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
              TVar8 = CONCAT22((short)(TVar8 >> 0x10),CONCAT11(bVar1,(char)TVar8));
              pAVar6 = (AssertionResult *)local_428[0].pos;
              ppVar7 = local_428[0].end;
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffb20);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,(char *)this_01,
                           (char *)expected_predicate_value);
                std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffb20,TVar8,(char *)in_stack_fffffffffffffb10,
                           in_stack_fffffffffffffb0c,(char *)in_stack_fffffffffffffb00);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                           (Message *)in_stack_fffffffffffffb68);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_428[0].pos);
                std::__cxx11::string::~string(local_478);
                testing::Message::~Message((Message *)0x1077e88);
                pAVar6 = (AssertionResult *)local_428[0].pos;
                ppVar7 = local_428[0].end;
              }
              local_12c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1077f19);
              if (local_12c == 0) {
                uVar10 = 6;
                file = (char *)google::
                               dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                               ::size((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                                       *)0x1077f42);
                uVar2 = SUB84(file,0);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                           (char *)in_stack_fffffffffffffb00,&ppVar7->first,(int *)pAVar6);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
                line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb0c);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffb20);
                  message = testing::AssertionResult::failure_message((AssertionResult *)0x1077feb);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffb20,TVar8,file,line,message);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)CONCAT44(uVar10,uVar2),
                             (Message *)in_stack_fffffffffffffb68);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar6);
                  testing::Message::~Message((Message *)0x107803f);
                }
                local_12c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10780a7);
                if (local_12c == 0) {
                  local_12c = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  google::
  dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::~dense_hash_map((dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                     *)0x10780cc);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EmplaceHint)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);

    h[1] = 1;
    h[3] = 3;
    h[5] = 5;

    ASSERT_FALSE(h.emplace_hint(h.find(1), 1, 0).second);
    ASSERT_FALSE(h.emplace_hint(h.find(3), 1, 0).second);
    ASSERT_FALSE(h.emplace_hint(h.end(), 1, 0).second);
    ASSERT_EQ(3, (int)h.size());

    ASSERT_TRUE(h.emplace_hint(h.find(1), 2, 0).second);
    ASSERT_TRUE(h.emplace_hint(h.find(3), 4, 0).second);
    ASSERT_TRUE(h.emplace_hint(h.end(), 6, 0).second);
    ASSERT_EQ(6, (int)h.size());
}